

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void blake2s224_test(void *key,int len,uint32_t seed,void *out)

{
  uint in_EDX;
  unsigned_long in_RDI;
  hash_state *in_stack_00000018;
  unsigned_long in_stack_00000050;
  uchar *in_stack_00000058;
  unsigned_long in_stack_00000060;
  hash_state *in_stack_00000068;
  
  blake2s_init(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050);
  ltc_state.blake2s.h[0] = in_EDX ^ 0x6a09e667;
  blake2s_process((hash_state *)CONCAT44(len,seed),(uchar *)out,in_RDI);
  blake2s_done(in_stack_00000018,(uchar *)key);
  return;
}

Assistant:

inline void blake2s224_test(const void * key, int len, uint32_t seed, void * out)
{
  // objsize
  blake2s_init(&ltc_state, 28, NULL, 0);
  ltc_state.blake2s.h[0] = 0x6A09E667UL ^ seed;
  blake2s_process(&ltc_state, (unsigned char *)key, len);
  blake2s_done(&ltc_state, (unsigned char *)out);
}